

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanLogicalDevice::WaitIdle(VulkanLogicalDevice *this)

{
  VkResult VVar1;
  string msg;
  string local_28;
  
  VVar1 = (*vkDeviceWaitIdle)(this->m_VkDevice);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[22]>(&local_28,(char (*) [22])"Failed to idle device");
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"WaitIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x9a);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void VulkanLogicalDevice::WaitIdle() const
{
    VkResult err = vkDeviceWaitIdle(m_VkDevice);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to idle device");
    (void)err;
}